

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::TestCaseFilters::addTags(TestCaseFilters *this,string *tagPattern)

{
  TagExpression exp;
  TagExpression local_68;
  TagExpressionParser local_50;
  
  local_50.m_exp = &local_68;
  local_68.m_tagSets.super__Vector_base<Catch::TagSet,_std::allocator<Catch::TagSet>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.m_tagSets.super__Vector_base<Catch::TagSet,_std::allocator<Catch::TagSet>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.m_tagSets.super__Vector_base<Catch::TagSet,_std::allocator<Catch::TagSet>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50.m_currentTagSet.m_tags._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_50.m_currentTagSet.m_tags._M_t._M_impl.super__Rb_tree_header._M_header;
  local_50.super_TagParser._vptr_TagParser = (_func_int **)&PTR__TagExpressionParser_00165258;
  local_50.m_isNegated = false;
  local_50.m_currentTagSet.m_tags._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_50.m_currentTagSet.m_tags._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_50.m_currentTagSet.m_tags._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_50.m_currentTagSet.m_tags._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_50.m_currentTagSet.m_tags._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  TagParser::parse(&local_50.super_TagParser,tagPattern);
  TagExpressionParser::~TagExpressionParser(&local_50);
  std::vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>::push_back
            (&this->m_tagExpressions,&local_68);
  std::vector<Catch::TagSet,_std::allocator<Catch::TagSet>_>::~vector(&local_68.m_tagSets);
  return;
}

Assistant:

void addTags( std::string const& tagPattern ) {
            TagExpression exp;
            TagExpressionParser( exp ).parse( tagPattern );

            m_tagExpressions.push_back( exp );
        }